

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O2

void (anonymous_namespace)::permutations<Imath_3_2::Vec3<double>>
               (vector<Imath_3_2::Vec3<double>,_std::allocator<Imath_3_2::Vec3<double>_>_> *perms)

{
  int level;
  vector<int,_std::allocator<int>_> value;
  
  std::vector<int,_std::allocator<int>_>::vector(&value,3,(allocator_type *)&level);
  level = -1;
  visit<Imath_3_2::Vec3<double>>(&level,3,0,&value,perms);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&value.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

static void
permutations (std::vector<T>& perms)
{
    std::vector<int> value (T::dimensions ());
    int              level = -1;
    int              n     = T::dimensions ();

    visit (level, n, 0, value, perms);
}